

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O1

void png_handle_zTXt(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  png_uint_32 pVar1;
  uint uVar2;
  int iVar3;
  png_bytep ppVar4;
  char *pcVar5;
  int in_R8D;
  ulong uVar6;
  png_alloc_size_t uncompressed_length;
  png_alloc_size_t local_70;
  png_text local_68;
  
  pVar1 = png_ptr->user_chunk_cache_max;
  if (pVar1 != 0) {
    if (pVar1 == 1) {
      png_crc_finish(png_ptr,length);
      return;
    }
    png_ptr->user_chunk_cache_max = pVar1 - 1;
    if (pVar1 - 1 == 1) {
      png_crc_finish(png_ptr,length);
      pcVar5 = "no space in chunk cache";
      goto LAB_0011ae47;
    }
  }
  uVar2 = png_ptr->mode;
  if ((uVar2 & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if ((uVar2 & 4) != 0) {
    png_ptr->mode = uVar2 | 8;
  }
  ppVar4 = png_read_buffer(png_ptr,(ulong)length,2);
  if (ppVar4 != (png_bytep)0x0) {
    png_crc_read(png_ptr,ppVar4,length);
    uVar6 = 0;
    iVar3 = png_crc_finish(png_ptr,0);
    if (iVar3 == 0) {
      if (length != 0) {
        uVar6 = 0;
        do {
          if (ppVar4[uVar6] == '\0') goto LAB_0011ae21;
          uVar6 = uVar6 + 1;
        } while (length != (png_uint_32)uVar6);
        uVar6 = (ulong)length;
      }
LAB_0011ae21:
      if ((int)uVar6 - 0x50U < 0xffffffb1) {
        pcVar5 = "bad keyword";
      }
      else if (length < (int)uVar6 + 3U) {
        pcVar5 = "truncated";
      }
      else {
        uVar6 = uVar6 & 0xffffffff;
        if (ppVar4[uVar6 + 1] == '\0') {
          local_70 = 0xffffffffffffffff;
          iVar3 = png_decompress_chunk(png_ptr,length,(png_uint_32)(uVar6 + 2),&local_70,in_R8D);
          if (iVar3 == 1) {
            ppVar4 = png_ptr->read_buffer;
            if (ppVar4 == (png_bytep)0x0) {
              pcVar5 = "Read failure in png_handle_zTXt";
            }
            else {
              ppVar4[uVar6 + 2 + local_70] = '\0';
              local_68.compression = 0;
              local_68.text = (png_charp)(ppVar4 + uVar6 + 2);
              local_68.text_length = local_70;
              local_68.itxt_length = 0;
              local_68.lang = (png_charp)0x0;
              local_68.lang_key = (png_charp)0x0;
              local_68.key = (png_charp)ppVar4;
              iVar3 = png_set_text_2(png_ptr,info_ptr,&local_68,1);
              pcVar5 = "insufficient memory";
              if (iVar3 == 0) {
                pcVar5 = (png_const_charp)0x0;
              }
            }
          }
          else {
            pcVar5 = (png_ptr->zstream).msg;
          }
        }
        else {
          pcVar5 = "unknown compression type";
        }
      }
      if (pcVar5 != (png_const_charp)0x0) {
        png_chunk_benign_error(png_ptr,pcVar5);
      }
    }
    return;
  }
  png_crc_finish(png_ptr,length);
  pcVar5 = "out of memory";
LAB_0011ae47:
  png_chunk_benign_error(png_ptr,pcVar5);
  return;
}

Assistant:

void /* PRIVATE */
png_handle_zTXt(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_const_charp errmsg = NULL;
   png_bytep       buffer;
   png_uint_32     keyword_length;

   png_debug(1, "in png_handle_zTXt");

#ifdef PNG_USER_LIMITS_SUPPORTED
   if (png_ptr->user_chunk_cache_max != 0)
   {
      if (png_ptr->user_chunk_cache_max == 1)
      {
         png_crc_finish(png_ptr, length);
         return;
      }

      if (--png_ptr->user_chunk_cache_max == 1)
      {
         png_crc_finish(png_ptr, length);
         png_chunk_benign_error(png_ptr, "no space in chunk cache");
         return;
      }
   }
#endif

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   if ((png_ptr->mode & PNG_HAVE_IDAT) != 0)
      png_ptr->mode |= PNG_AFTER_IDAT;

   /* Note, "length" is sufficient here; we won't be adding
    * a null terminator later.
    */
   buffer = png_read_buffer(png_ptr, length, 2/*silent*/);

   if (buffer == NULL)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of memory");
      return;
   }

   png_crc_read(png_ptr, buffer, length);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   /* TODO: also check that the keyword contents match the spec! */
   for (keyword_length = 0;
      keyword_length < length && buffer[keyword_length] != 0;
      ++keyword_length)
      /* Empty loop to find end of name */ ;

   if (keyword_length > 79 || keyword_length < 1)
      errmsg = "bad keyword";

   /* zTXt must have some LZ data after the keyword, although it may expand to
    * zero bytes; we need a '\0' at the end of the keyword, the compression type
    * then the LZ data:
    */
   else if (keyword_length + 3 > length)
      errmsg = "truncated";

   else if (buffer[keyword_length+1] != PNG_COMPRESSION_TYPE_BASE)
      errmsg = "unknown compression type";

   else
   {
      png_alloc_size_t uncompressed_length = PNG_SIZE_MAX;

      /* TODO: at present png_decompress_chunk imposes a single application
       * level memory limit, this should be split to different values for iCCP
       * and text chunks.
       */
      if (png_decompress_chunk(png_ptr, length, keyword_length+2,
          &uncompressed_length, 1/*terminate*/) == Z_STREAM_END)
      {
         png_text text;

         if (png_ptr->read_buffer == NULL)
           errmsg="Read failure in png_handle_zTXt";
         else
         {
            /* It worked; png_ptr->read_buffer now looks like a tEXt chunk
             * except for the extra compression type byte and the fact that
             * it isn't necessarily '\0' terminated.
             */
            buffer = png_ptr->read_buffer;
            buffer[uncompressed_length+(keyword_length+2)] = 0;

            text.compression = PNG_TEXT_COMPRESSION_zTXt;
            text.key = (png_charp)buffer;
            text.text = (png_charp)(buffer + keyword_length+2);
            text.text_length = uncompressed_length;
            text.itxt_length = 0;
            text.lang = NULL;
            text.lang_key = NULL;

            if (png_set_text_2(png_ptr, info_ptr, &text, 1) != 0)
               errmsg = "insufficient memory";
         }
      }

      else
         errmsg = png_ptr->zstream.msg;
   }

   if (errmsg != NULL)
      png_chunk_benign_error(png_ptr, errmsg);
}